

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall jsonnet::internal::anon_unknown_0::Stack::~Stack(Stack *this)

{
  pointer this_00;
  long lVar1;
  allocator<jsonnet::internal::(anonymous_namespace)::Frame> *in_RDX;
  
  this->_vptr_Stack = (_func_int **)&PTR_dump_0022c668;
  std::
  _Destroy<jsonnet::internal::(anonymous_namespace)::Frame*,jsonnet::internal::(anonymous_namespace)::Frame>
            ((this->stack).
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->stack).
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish,in_RDX);
  this_00 = (this->stack).
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(this->stack).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ::_M_deallocate((_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                   *)this_00,(pointer)(lVar1 / 400),lVar1 % 400);
  return;
}

Assistant:

~Stack(void) {}